

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O0

float compute_error_of_weight_set_2planes
                (endpoints_and_weights *eai1,endpoints_and_weights *eai2,decimation_info *di,
                float *dec_weight_quant_uvalue_plane1,float *dec_weight_quant_uvalue_plane2)

{
  undefined8 *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  float fVar14;
  uint uVar15;
  long in_RCX;
  byte *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  float fVar16;
  undefined8 uVar17;
  float fVar19;
  undefined8 uVar18;
  float fVar20;
  undefined8 uVar21;
  float fVar23;
  undefined8 uVar22;
  float fVar24;
  undefined8 uVar25;
  float fVar27;
  undefined8 uVar26;
  float fVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  vfloat error2_2;
  vfloat actual_values2_2;
  vfloat current_values2_2;
  vfloat error1_2;
  vfloat diff_2;
  vfloat actual_values1_2;
  vfloat current_values1_2;
  uint i_2;
  vfloat error2_1;
  vfloat actual_values2_1;
  vfloat current_values2_1;
  vfloat error1_1;
  vfloat diff_1;
  vfloat actual_values1_1;
  vfloat current_values1_1;
  uint i_1;
  vfloat error2;
  vfloat actual_values2;
  vfloat current_values2;
  vfloat error1;
  vfloat diff;
  vfloat actual_values1;
  vfloat current_values1;
  uint i;
  uint texel_count;
  vfloatacc error_summav;
  undefined8 in_stack_ffffffffffffd660;
  uint index;
  float *in_stack_ffffffffffffd668;
  decimation_info *in_stack_ffffffffffffd670;
  undefined8 in_stack_ffffffffffffd7e0;
  float *in_stack_ffffffffffffd7e8;
  decimation_info *in_stack_ffffffffffffd7f0;
  uint local_27e4;
  uint local_24e4;
  uint local_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  long local_21b0;
  long local_21a8;
  undefined1 local_21a0 [408];
  undefined8 *local_2008;
  undefined1 local_2000 [56];
  undefined1 (*local_1fc8) [32];
  undefined1 local_1fc0 [56];
  undefined8 *local_1f88;
  undefined1 local_1f80 [56];
  undefined1 (*local_1f48) [32];
  undefined1 local_1f40 [56];
  undefined8 *local_1f08;
  undefined1 local_1f00 [56];
  undefined1 (*local_1ec8) [32];
  undefined1 local_1ec0 [56];
  undefined8 *local_1e88;
  undefined1 local_1e80 [56];
  undefined1 (*local_1e48) [32];
  undefined1 local_1e40 [224];
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined1 local_1d20 [32];
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined1 local_1cc0 [32];
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined1 local_1c60 [32];
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined1 local_1c00 [416];
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined1 local_1a20 [32];
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined1 local_19c0 [32];
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined1 local_1960 [32];
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined1 local_1900 [32];
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined1 local_18a0 [32];
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined1 local_1840 [32];
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined1 local_17e0 [32];
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined1 local_1780 [176];
  undefined8 local_16d0;
  undefined8 uStack_16c8;
  undefined1 local_16c0 [16];
  undefined8 local_16b0;
  undefined8 uStack_16a8;
  undefined1 local_16a0 [24];
  undefined8 *local_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1650;
  undefined8 uStack_1648;
  undefined1 local_1640 [16];
  undefined8 local_1630;
  undefined8 uStack_1628;
  undefined1 local_1620 [24];
  undefined8 *local_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined1 local_1520 [32];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined1 local_14c0 [48];
  undefined8 local_1490;
  undefined8 uStack_1488;
  undefined1 *local_1478;
  undefined8 local_1470;
  undefined8 uStack_1468;
  undefined1 *local_1458;
  undefined8 local_1450;
  undefined8 uStack_1448;
  undefined1 *local_1438;
  undefined8 local_1430;
  undefined8 uStack_1428;
  undefined1 *local_1418;
  undefined8 local_13d0;
  undefined8 uStack_13c8;
  undefined1 *local_13b8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined1 (*local_1390) [32];
  undefined8 *local_1388;
  undefined1 (*local_1380) [32];
  undefined8 *local_1378;
  undefined1 (*local_1370) [32];
  undefined8 *local_1368;
  undefined1 (*local_1360) [32];
  undefined8 *local_1358;
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  undefined1 *local_12e8;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  undefined1 *local_12a8;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  undefined1 *local_1228;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  undefined1 *local_11e8;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  undefined1 *local_11a8;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined1 *local_1168;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined1 *local_1128;
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  undefined1 *local_10e8;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  undefined1 *local_10a8;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  undefined1 *local_1068;
  undefined1 local_f60 [32];
  undefined1 *local_f28;
  undefined1 local_f20 [32];
  undefined1 *local_ee8;
  undefined1 local_ee0 [32];
  undefined1 *local_ea8;
  undefined1 local_ea0 [32];
  undefined1 *local_e68;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined1 *local_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined1 *local_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined1 *local_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined1 *local_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined1 *local_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined1 *local_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined1 *local_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined1 *local_be8;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 *local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined1 local_570 [16];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  undefined1 *local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined1 local_4d0 [16];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  undefined1 *local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 *local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined1 *local_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 *local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_390 [16];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined1 *local_368;
  float local_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float local_150;
  float fStack_14c;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  local_13a0 = 0;
  uStack_1398 = 0;
  local_13b8 = local_21a0;
  local_13d0 = 0;
  uStack_13c8 = 0;
  local_21e0 = 0;
  uStack_21d8 = 0;
  uVar15 = (uint)*in_RDX;
  if (uVar15 == 0) {
    __assert_fail("texel_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0x2f9,
                  "float compute_error_of_weight_set_2planes(const endpoints_and_weights &, const endpoints_and_weights &, const decimation_info &, const float *, const float *)"
                 );
  }
  local_21b0 = in_RSI;
  local_21a8 = in_RDI;
  if (in_RDX[1] < 3) {
    if (in_RDX[1] < 2) {
      for (local_27e4 = 0; local_27e4 < uVar15; local_27e4 = local_27e4 + 8) {
        auVar2 = vsubps_avx(*(undefined1 (*) [32])(in_RCX + (ulong)local_27e4 * 4),
                            *(undefined1 (*) [32])(in_RDI + 0xa0 + (ulong)local_27e4 * 4));
        local_6c0 = auVar2._0_4_;
        fStack_6bc = auVar2._4_4_;
        fStack_6b8 = auVar2._8_4_;
        fStack_6b4 = auVar2._12_4_;
        fStack_6b0 = auVar2._16_4_;
        fStack_6ac = auVar2._20_4_;
        fStack_6a8 = auVar2._24_4_;
        fStack_6a4 = auVar2._28_4_;
        puVar1 = (undefined8 *)(in_RDI + 0x400 + (ulong)local_27e4 * 4);
        local_6a0 = (float)*puVar1;
        fStack_69c = (float)((ulong)*puVar1 >> 0x20);
        fStack_698 = (float)puVar1[1];
        fStack_694 = (float)((ulong)puVar1[1] >> 0x20);
        fStack_690 = (float)puVar1[2];
        fStack_68c = (float)((ulong)puVar1[2] >> 0x20);
        fStack_688 = (float)puVar1[3];
        auVar2 = vsubps_avx(*(undefined1 (*) [32])(in_R8 + (ulong)local_27e4 * 4),
                            *(undefined1 (*) [32])(in_RSI + 0xa0 + (ulong)local_27e4 * 4));
        local_640 = auVar2._0_4_;
        fStack_63c = auVar2._4_4_;
        fStack_638 = auVar2._8_4_;
        fStack_634 = auVar2._12_4_;
        fStack_630 = auVar2._16_4_;
        fStack_62c = auVar2._20_4_;
        fStack_628 = auVar2._24_4_;
        fStack_624 = auVar2._28_4_;
        puVar1 = (undefined8 *)(in_RSI + 0x400 + (ulong)local_27e4 * 4);
        local_620 = (float)*puVar1;
        fStack_61c = (float)((ulong)*puVar1 >> 0x20);
        fStack_618 = (float)puVar1[1];
        fStack_614 = (float)((ulong)puVar1[1] >> 0x20);
        fStack_610 = (float)puVar1[2];
        fStack_60c = (float)((ulong)puVar1[2] >> 0x20);
        fStack_608 = (float)puVar1[3];
        local_210 = (float)local_21e0;
        fStack_20c = (float)((ulong)local_21e0 >> 0x20);
        fStack_208 = (float)uStack_21d8;
        fStack_204 = (float)((ulong)uStack_21d8 >> 0x20);
        local_21e0 = CONCAT44(fStack_20c +
                              fStack_6bc * fStack_6bc * fStack_69c +
                              fStack_63c * fStack_63c * fStack_61c +
                              fStack_6ac * fStack_6ac * fStack_68c +
                              fStack_62c * fStack_62c * fStack_60c,
                              local_210 +
                              local_6c0 * local_6c0 * local_6a0 + local_640 * local_640 * local_620
                              + fStack_6b0 * fStack_6b0 * fStack_690 +
                                fStack_630 * fStack_630 * fStack_610);
        uStack_21d8 = CONCAT44(fStack_204 +
                               fStack_6b4 * fStack_6b4 * fStack_694 +
                               fStack_634 * fStack_634 * fStack_614 + fStack_6a4 + fStack_624,
                               fStack_208 +
                               fStack_6b8 * fStack_6b8 * fStack_698 +
                               fStack_638 * fStack_638 * fStack_618 +
                               fStack_6a8 * fStack_6a8 * fStack_688 +
                               fStack_628 * fStack_628 * fStack_608);
      }
    }
    else {
      local_24e4 = 0;
      while( true ) {
        uVar25 = 0;
        uVar29 = 0;
        if (uVar15 <= local_24e4) break;
        index = (uint)((ulong)in_stack_ffffffffffffd660 >> 0x20);
        uVar17 = local_21e0;
        uVar21 = uStack_21d8;
        bilinear_infill_vla_2(in_stack_ffffffffffffd670,in_stack_ffffffffffffd668,index);
        local_1f48 = (undefined1 (*) [32])(local_21a8 + 0xa0 + (ulong)local_24e4 * 4);
        local_1d00 = *(undefined8 *)*local_1f48;
        uStack_1cf8 = *(undefined8 *)(*local_1f48 + 8);
        uStack_1cf0 = *(undefined8 *)(*local_1f48 + 0x10);
        uStack_1ce8 = *(undefined8 *)(*local_1f48 + 0x18);
        local_ca8 = local_1f40;
        auVar2._8_8_ = uVar21;
        auVar2._0_8_ = uVar17;
        auVar2._16_8_ = uVar25;
        auVar2._24_8_ = uVar29;
        local_ee0 = vsubps_avx(auVar2,*local_1f48);
        local_ea8 = local_1cc0;
        local_1920 = local_ee0._0_8_;
        uStack_1918 = local_ee0._8_8_;
        uStack_1910 = local_ee0._16_8_;
        uStack_1908 = local_ee0._24_8_;
        local_1940 = local_ee0._0_8_;
        uStack_1938 = local_ee0._8_8_;
        uStack_1930 = local_ee0._16_8_;
        uStack_1928 = local_ee0._24_8_;
        local_7c0 = local_ee0._0_8_;
        uVar10 = local_7c0;
        uStack_7b8 = local_ee0._8_8_;
        uVar11 = uStack_7b8;
        uStack_7b0 = local_ee0._16_8_;
        uVar12 = uStack_7b0;
        uStack_7a8 = local_ee0._24_8_;
        uVar13 = uStack_7a8;
        local_7e0 = local_ee0._0_8_;
        uStack_7d8 = local_ee0._8_8_;
        uStack_7d0 = local_ee0._16_8_;
        uStack_7c8 = local_ee0._24_8_;
        local_7c0._0_4_ = local_ee0._0_4_;
        local_7c0._4_4_ = local_ee0._4_4_;
        uStack_7b8._0_4_ = local_ee0._8_4_;
        uStack_7b8._4_4_ = local_ee0._12_4_;
        uStack_7b0._0_4_ = local_ee0._16_4_;
        uStack_7b0._4_4_ = local_ee0._20_4_;
        uStack_7a8._0_4_ = local_ee0._24_4_;
        uStack_7a8._4_4_ = local_ee0._28_4_;
        fVar14 = uStack_7a8._4_4_;
        local_1160 = (float)local_7c0 * (float)local_7c0;
        fStack_115c = local_7c0._4_4_ * local_7c0._4_4_;
        fStack_1158 = (float)uStack_7b8 * (float)uStack_7b8;
        fStack_1154 = uStack_7b8._4_4_ * uStack_7b8._4_4_;
        fStack_1150 = (float)uStack_7b0 * (float)uStack_7b0;
        fStack_114c = uStack_7b0._4_4_ * uStack_7b0._4_4_;
        fStack_1148 = (float)uStack_7a8 * (float)uStack_7a8;
        local_1128 = local_1900;
        fStack_1144 = uStack_7a8._4_4_;
        local_1980 = CONCAT44(fStack_115c,local_1160);
        uStack_1978 = CONCAT44(fStack_1154,fStack_1158);
        uStack_1970 = CONCAT44(fStack_114c,fStack_1150);
        uStack_1968 = CONCAT44(uStack_7a8._4_4_,fStack_1148);
        local_1f88 = (undefined8 *)(local_21a8 + 0x400 + (ulong)local_24e4 * 4);
        local_19a0 = *local_1f88;
        uStack_1998 = local_1f88[1];
        uStack_1990 = local_1f88[2];
        uStack_1988 = local_1f88[3];
        local_c68 = local_1f80;
        local_7a0._0_4_ = (float)local_19a0;
        local_7a0._4_4_ = (float)((ulong)local_19a0 >> 0x20);
        uStack_798._0_4_ = (float)uStack_1998;
        uStack_798._4_4_ = (float)((ulong)uStack_1998 >> 0x20);
        uStack_790._0_4_ = (float)uStack_1990;
        uStack_790._4_4_ = (float)((ulong)uStack_1990 >> 0x20);
        uStack_788._0_4_ = (float)uStack_1988;
        fVar16 = local_1160 * (float)local_7a0;
        fVar19 = fStack_115c * local_7a0._4_4_;
        fVar20 = fStack_1158 * (float)uStack_798;
        fVar23 = fStack_1154 * uStack_798._4_4_;
        fVar24 = fStack_1150 * (float)uStack_790;
        fVar27 = fStack_114c * uStack_790._4_4_;
        fVar28 = fStack_1148 * (float)uStack_788;
        local_10e8 = local_1960;
        fStack_1104 = uStack_7a8._4_4_;
        uVar17 = CONCAT44(fVar19,fVar16);
        uVar21 = CONCAT44(fVar23,fVar20);
        uVar4 = CONCAT44(fVar27,fVar24);
        uVar5 = CONCAT44(uStack_7a8._4_4_,fVar28);
        uVar18 = uVar17;
        uVar22 = uVar21;
        uVar26 = uVar4;
        uVar30 = uVar5;
        uStack_1cd0 = uVar25;
        uStack_1cc8 = uVar29;
        local_1370 = local_1f48;
        local_1368 = local_1f88;
        local_1120 = fVar16;
        fStack_111c = fVar19;
        fStack_1118 = fVar20;
        fStack_1114 = fVar23;
        fStack_1110 = fVar24;
        fStack_110c = fVar27;
        fStack_1108 = fVar28;
        local_ce0 = local_1d00;
        uStack_cd8 = uStack_1cf8;
        uStack_cd0 = uStack_1cf0;
        uStack_cc8 = uStack_1ce8;
        local_ca0 = local_19a0;
        uStack_c98 = uStack_1998;
        uStack_c90 = uStack_1990;
        uStack_c88 = uStack_1988;
        local_9e0 = local_1d00;
        uStack_9d8 = uStack_1cf8;
        uStack_9d0 = uStack_1cf0;
        uStack_9c8 = uStack_1ce8;
        uStack_9b0 = uVar25;
        uStack_9a8 = uVar29;
        local_7c0 = uVar10;
        uStack_7b8 = uVar11;
        uStack_7b0 = uVar12;
        uStack_7a8 = uVar13;
        local_7a0 = local_19a0;
        uStack_798 = uStack_1998;
        uStack_790 = uStack_1990;
        uStack_788 = uStack_1988;
        local_780 = local_1980;
        uStack_778 = uStack_1978;
        uStack_770 = uStack_1970;
        uStack_768 = uStack_1968;
        bilinear_infill_vla_2(in_stack_ffffffffffffd670,in_stack_ffffffffffffd668,index);
        local_1fc8 = (undefined1 (*) [32])(local_21b0 + 0xa0 + (ulong)local_24e4 * 4);
        local_1d60 = *(undefined8 *)*local_1fc8;
        uStack_1d58 = *(undefined8 *)(*local_1fc8 + 8);
        uStack_1d50 = *(undefined8 *)(*local_1fc8 + 0x10);
        uStack_1d48 = *(undefined8 *)(*local_1fc8 + 0x18);
        local_c28 = local_1fc0;
        auVar8._8_8_ = uVar22;
        auVar8._0_8_ = uVar18;
        auVar8._16_8_ = uVar26;
        auVar8._24_8_ = uVar30;
        local_ea0 = vsubps_avx(auVar8,*local_1fc8);
        local_e68 = local_1d20;
        local_19e0 = local_ea0._0_8_;
        uStack_19d8 = local_ea0._8_8_;
        uStack_19d0 = local_ea0._16_8_;
        uStack_19c8 = local_ea0._24_8_;
        local_1a00 = local_ea0._0_8_;
        uStack_19f8 = local_ea0._8_8_;
        uStack_19f0 = local_ea0._16_8_;
        uStack_19e8 = local_ea0._24_8_;
        local_740 = local_ea0._0_8_;
        uVar25 = local_740;
        uStack_738 = local_ea0._8_8_;
        uVar29 = uStack_738;
        uStack_730 = local_ea0._16_8_;
        uVar10 = uStack_730;
        uStack_728 = local_ea0._24_8_;
        uVar11 = uStack_728;
        local_760 = local_ea0._0_8_;
        uStack_758 = local_ea0._8_8_;
        uStack_750 = local_ea0._16_8_;
        uStack_748 = local_ea0._24_8_;
        local_740._0_4_ = local_ea0._0_4_;
        local_740._4_4_ = local_ea0._4_4_;
        uStack_738._0_4_ = local_ea0._8_4_;
        uStack_738._4_4_ = local_ea0._12_4_;
        uStack_730._0_4_ = local_ea0._16_4_;
        uStack_730._4_4_ = local_ea0._20_4_;
        uStack_728._0_4_ = local_ea0._24_4_;
        uStack_728._4_4_ = local_ea0._28_4_;
        local_10e0 = (float)local_740 * (float)local_740;
        fStack_10dc = local_740._4_4_ * local_740._4_4_;
        fStack_10d8 = (float)uStack_738 * (float)uStack_738;
        fStack_10d4 = uStack_738._4_4_ * uStack_738._4_4_;
        fStack_10d0 = (float)uStack_730 * (float)uStack_730;
        fStack_10cc = uStack_730._4_4_ * uStack_730._4_4_;
        fStack_10c8 = (float)uStack_728 * (float)uStack_728;
        local_10a8 = local_19c0;
        fStack_10c4 = uStack_728._4_4_;
        local_1a40 = CONCAT44(fStack_10dc,local_10e0);
        uStack_1a38 = CONCAT44(fStack_10d4,fStack_10d8);
        uStack_1a30 = CONCAT44(fStack_10cc,fStack_10d0);
        uStack_1a28 = CONCAT44(uStack_728._4_4_,fStack_10c8);
        local_2008 = (undefined8 *)(local_21b0 + 0x400 + (ulong)local_24e4 * 4);
        local_1a60 = *local_2008;
        uStack_1a58 = local_2008[1];
        uStack_1a50 = local_2008[2];
        uStack_1a48 = local_2008[3];
        local_be8 = local_2000;
        local_720._0_4_ = (float)local_1a60;
        local_720._4_4_ = (float)((ulong)local_1a60 >> 0x20);
        uStack_718._0_4_ = (float)uStack_1a58;
        uStack_718._4_4_ = (float)((ulong)uStack_1a58 >> 0x20);
        uStack_710._0_4_ = (float)uStack_1a50;
        uStack_710._4_4_ = (float)((ulong)uStack_1a50 >> 0x20);
        uStack_708._0_4_ = (float)uStack_1a48;
        local_10a0 = local_10e0 * (float)local_720;
        fStack_109c = fStack_10dc * local_720._4_4_;
        fStack_1098 = fStack_10d8 * (float)uStack_718;
        fStack_1094 = fStack_10d4 * uStack_718._4_4_;
        fStack_1090 = fStack_10d0 * (float)uStack_710;
        fStack_108c = fStack_10cc * uStack_710._4_4_;
        fStack_1088 = fStack_10c8 * (float)uStack_708;
        local_1068 = local_1a20;
        fStack_1084 = uStack_728._4_4_;
        local_1560 = CONCAT44(fStack_109c,local_10a0);
        uStack_1558 = CONCAT44(fStack_1094,fStack_1098);
        uStack_1550 = CONCAT44(fStack_108c,fStack_1090);
        uStack_1548 = CONCAT44(uStack_728._4_4_,fStack_1088);
        local_12e0 = fVar16 + local_10a0;
        fStack_12dc = fVar19 + fStack_109c;
        fStack_12d8 = fVar20 + fStack_1098;
        fStack_12d4 = fVar23 + fStack_1094;
        fStack_12d0 = fVar24 + fStack_1090;
        fStack_12cc = fVar27 + fStack_108c;
        fStack_12c8 = fVar28 + fStack_1088;
        fStack_12c4 = fVar14 + uStack_728._4_4_;
        local_12a8 = local_1520;
        local_16b0 = CONCAT44(fStack_12dc,local_12e0);
        uStack_16a8 = CONCAT44(fStack_12d4,fStack_12d8);
        local_16d0 = CONCAT44(fStack_12cc,fStack_12d0);
        uStack_16c8 = CONCAT44(fStack_12c4,fStack_12c8);
        local_1688 = &local_21e0;
        local_1418 = local_16a0;
        local_3f0 = local_21e0;
        uStack_3e8 = uStack_21d8;
        local_1d0._0_4_ = (float)local_21e0;
        local_1d0._4_4_ = (float)((ulong)local_21e0 >> 0x20);
        uStack_1c8._0_4_ = (float)uStack_21d8;
        uStack_1c8._4_4_ = (float)((ulong)uStack_21d8 >> 0x20);
        local_380 = (float)local_1d0 + local_12e0;
        fStack_37c = local_1d0._4_4_ + fStack_12dc;
        fStack_378 = (float)uStack_1c8 + fStack_12d8;
        fStack_374 = uStack_1c8._4_4_ + fStack_12d4;
        local_368 = local_390;
        local_490 = CONCAT44(fStack_37c,local_380);
        uStack_488 = CONCAT44(fStack_374,fStack_378);
        local_1438 = local_16c0;
        local_420 = local_380 + fStack_12d0;
        fStack_41c = fStack_37c + fStack_12cc;
        fStack_418 = fStack_378 + fStack_12c8;
        fStack_414 = fStack_374 + fStack_12c4;
        local_408 = local_430;
        local_21e0 = CONCAT44(fStack_41c,local_420);
        uStack_21d8 = CONCAT44(fStack_414,fStack_418);
        local_24e4 = local_24e4 + 8;
        local_1680 = local_16b0;
        uStack_1678 = uStack_16a8;
        uStack_1670 = local_16d0;
        uStack_1668 = uStack_16c8;
        local_1540 = uVar17;
        uStack_1538 = uVar21;
        uStack_1530 = uVar4;
        uStack_1528 = uVar5;
        local_1450 = local_16d0;
        uStack_1448 = uStack_16c8;
        local_1430 = local_16b0;
        uStack_1428 = uStack_16a8;
        local_1360 = local_1fc8;
        local_1358 = local_2008;
        local_c60 = local_1d60;
        uStack_c58 = uStack_1d58;
        uStack_c50 = uStack_1d50;
        uStack_c48 = uStack_1d48;
        local_c20 = local_1a60;
        uStack_c18 = uStack_1a58;
        uStack_c10 = uStack_1a50;
        uStack_c08 = uStack_1a48;
        local_9a0 = local_1d60;
        uStack_998 = uStack_1d58;
        uStack_990 = uStack_1d50;
        uStack_988 = uStack_1d48;
        local_740 = uVar25;
        uStack_738 = uVar29;
        uStack_730 = uVar10;
        uStack_728 = uVar11;
        local_720 = local_1a60;
        uStack_718 = uStack_1a58;
        uStack_710 = uStack_1a50;
        uStack_708 = uStack_1a48;
        local_700 = local_1a40;
        uStack_6f8 = uStack_1a38;
        uStack_6f0 = uStack_1a30;
        uStack_6e8 = uStack_1a28;
        local_4a0 = local_16d0;
        uStack_498 = uStack_16c8;
        local_480 = local_21e0;
        uStack_478 = uStack_21d8;
        local_468 = local_1688;
        local_460 = local_16d0;
        uStack_458 = uStack_16c8;
        local_450 = local_16d0;
        uStack_448 = uStack_16c8;
        local_440 = local_490;
        uStack_438 = uStack_488;
        local_400 = local_16b0;
        uStack_3f8 = uStack_16a8;
        local_3e0 = local_490;
        uStack_3d8 = uStack_488;
        local_3c8 = local_1688;
        local_3c0 = local_16b0;
        uStack_3b8 = uStack_16a8;
        local_3b0 = local_16b0;
        uStack_3a8 = uStack_16a8;
        local_3a0 = local_3f0;
        uStack_398 = uStack_3e8;
        local_1e0 = local_16b0;
        uStack_1d8 = uStack_16a8;
        local_1d0 = local_3f0;
        uStack_1c8 = uStack_3e8;
        local_1c0 = local_16d0;
        uStack_1b8 = uStack_16c8;
        local_1b0 = local_490;
        uStack_1a8 = uStack_488;
        local_c0 = local_1560;
        uStack_b8 = uStack_1558;
        uStack_b0 = uStack_1550;
        uStack_a8 = uStack_1548;
        local_a0 = uVar17;
        uStack_98 = uVar21;
        uStack_90 = uVar4;
        uStack_88 = uVar5;
      }
    }
  }
  else {
    local_21e8 = 0;
    while( true ) {
      uVar25 = 0;
      uVar29 = 0;
      if (uVar15 <= local_21e8) break;
      uVar17 = local_21e0;
      uVar21 = uStack_21d8;
      bilinear_infill_vla(in_stack_ffffffffffffd7f0,in_stack_ffffffffffffd7e8,
                          (uint)((ulong)in_stack_ffffffffffffd7e0 >> 0x20));
      local_1e48 = (undefined1 (*) [32])(local_21a8 + 0xa0 + (ulong)local_21e8 * 4);
      local_1c40 = *(undefined8 *)*local_1e48;
      uStack_1c38 = *(undefined8 *)(*local_1e48 + 8);
      uStack_1c30 = *(undefined8 *)(*local_1e48 + 0x10);
      uStack_1c28 = *(undefined8 *)(*local_1e48 + 0x18);
      local_da8 = local_1e40;
      auVar6._8_8_ = uVar21;
      auVar6._0_8_ = uVar17;
      auVar6._16_8_ = uVar25;
      auVar6._24_8_ = uVar29;
      local_f60 = vsubps_avx(auVar6,*local_1e48);
      local_f28 = local_1c00;
      local_17a0 = local_f60._0_8_;
      uStack_1798 = local_f60._8_8_;
      uStack_1790 = local_f60._16_8_;
      uStack_1788 = local_f60._24_8_;
      local_17c0 = local_f60._0_8_;
      uStack_17b8 = local_f60._8_8_;
      uStack_17b0 = local_f60._16_8_;
      uStack_17a8 = local_f60._24_8_;
      local_8c0 = local_f60._0_8_;
      uVar10 = local_8c0;
      uStack_8b8 = local_f60._8_8_;
      uVar11 = uStack_8b8;
      uStack_8b0 = local_f60._16_8_;
      uVar12 = uStack_8b0;
      uStack_8a8 = local_f60._24_8_;
      uVar13 = uStack_8a8;
      local_8e0 = local_f60._0_8_;
      uStack_8d8 = local_f60._8_8_;
      uStack_8d0 = local_f60._16_8_;
      uStack_8c8 = local_f60._24_8_;
      local_8c0._0_4_ = local_f60._0_4_;
      local_8c0._4_4_ = local_f60._4_4_;
      uStack_8b8._0_4_ = local_f60._8_4_;
      uStack_8b8._4_4_ = local_f60._12_4_;
      uStack_8b0._0_4_ = local_f60._16_4_;
      uStack_8b0._4_4_ = local_f60._20_4_;
      uStack_8a8._0_4_ = local_f60._24_4_;
      uStack_8a8._4_4_ = local_f60._28_4_;
      fVar14 = uStack_8a8._4_4_;
      local_1260 = (float)local_8c0 * (float)local_8c0;
      fStack_125c = local_8c0._4_4_ * local_8c0._4_4_;
      fStack_1258 = (float)uStack_8b8 * (float)uStack_8b8;
      fStack_1254 = uStack_8b8._4_4_ * uStack_8b8._4_4_;
      fStack_1250 = (float)uStack_8b0 * (float)uStack_8b0;
      fStack_124c = uStack_8b0._4_4_ * uStack_8b0._4_4_;
      fStack_1248 = (float)uStack_8a8 * (float)uStack_8a8;
      local_1228 = local_1780;
      fStack_1244 = uStack_8a8._4_4_;
      local_1800 = CONCAT44(fStack_125c,local_1260);
      uStack_17f8 = CONCAT44(fStack_1254,fStack_1258);
      uStack_17f0 = CONCAT44(fStack_124c,fStack_1250);
      uStack_17e8 = CONCAT44(uStack_8a8._4_4_,fStack_1248);
      local_1e88 = (undefined8 *)(local_21a8 + 0x400 + (ulong)local_21e8 * 4);
      local_1820 = *local_1e88;
      uStack_1818 = local_1e88[1];
      uStack_1810 = local_1e88[2];
      uStack_1808 = local_1e88[3];
      local_d68 = local_1e80;
      local_8a0._0_4_ = (float)local_1820;
      local_8a0._4_4_ = (float)((ulong)local_1820 >> 0x20);
      uStack_898._0_4_ = (float)uStack_1818;
      uStack_898._4_4_ = (float)((ulong)uStack_1818 >> 0x20);
      uStack_890._0_4_ = (float)uStack_1810;
      uStack_890._4_4_ = (float)((ulong)uStack_1810 >> 0x20);
      uStack_888._0_4_ = (float)uStack_1808;
      fVar16 = local_1260 * (float)local_8a0;
      fVar19 = fStack_125c * local_8a0._4_4_;
      fVar20 = fStack_1258 * (float)uStack_898;
      fVar23 = fStack_1254 * uStack_898._4_4_;
      fVar24 = fStack_1250 * (float)uStack_890;
      fVar27 = fStack_124c * uStack_890._4_4_;
      fVar28 = fStack_1248 * (float)uStack_888;
      local_11e8 = local_17e0;
      fStack_1204 = uStack_8a8._4_4_;
      uVar17 = CONCAT44(fVar19,fVar16);
      uVar21 = CONCAT44(fVar23,fVar20);
      uVar4 = CONCAT44(fVar27,fVar24);
      uVar5 = CONCAT44(uStack_8a8._4_4_,fVar28);
      uVar18 = uVar17;
      uVar22 = uVar21;
      uVar26 = uVar4;
      uVar30 = uVar5;
      uStack_1c10 = uVar25;
      uStack_1c08 = uVar29;
      local_1390 = local_1e48;
      local_1388 = local_1e88;
      local_1220 = fVar16;
      fStack_121c = fVar19;
      fStack_1218 = fVar20;
      fStack_1214 = fVar23;
      fStack_1210 = fVar24;
      fStack_120c = fVar27;
      fStack_1208 = fVar28;
      local_de0 = local_1c40;
      uStack_dd8 = uStack_1c38;
      uStack_dd0 = uStack_1c30;
      uStack_dc8 = uStack_1c28;
      local_da0 = local_1820;
      uStack_d98 = uStack_1818;
      uStack_d90 = uStack_1810;
      uStack_d88 = uStack_1808;
      local_a60 = local_1c40;
      uStack_a58 = uStack_1c38;
      uStack_a50 = uStack_1c30;
      uStack_a48 = uStack_1c28;
      uStack_a30 = uVar25;
      uStack_a28 = uVar29;
      local_8c0 = uVar10;
      uStack_8b8 = uVar11;
      uStack_8b0 = uVar12;
      uStack_8a8 = uVar13;
      local_8a0 = local_1820;
      uStack_898 = uStack_1818;
      uStack_890 = uStack_1810;
      uStack_888 = uStack_1808;
      local_880 = local_1800;
      uStack_878 = uStack_17f8;
      uStack_870 = uStack_17f0;
      uStack_868 = uStack_17e8;
      bilinear_infill_vla(in_stack_ffffffffffffd7f0,in_stack_ffffffffffffd7e8,
                          (uint)((ulong)in_stack_ffffffffffffd7e0 >> 0x20));
      local_1ec8 = (undefined1 (*) [32])(local_21b0 + 0xa0 + (ulong)local_21e8 * 4);
      local_1ca0 = *(undefined8 *)*local_1ec8;
      uStack_1c98 = *(undefined8 *)(*local_1ec8 + 8);
      uStack_1c90 = *(undefined8 *)(*local_1ec8 + 0x10);
      uStack_1c88 = *(undefined8 *)(*local_1ec8 + 0x18);
      local_d28 = local_1ec0;
      auVar7._8_8_ = uVar22;
      auVar7._0_8_ = uVar18;
      auVar7._16_8_ = uVar26;
      auVar7._24_8_ = uVar30;
      local_f20 = vsubps_avx(auVar7,*local_1ec8);
      local_ee8 = local_1c60;
      local_1860 = local_f20._0_8_;
      uStack_1858 = local_f20._8_8_;
      uStack_1850 = local_f20._16_8_;
      uStack_1848 = local_f20._24_8_;
      local_1880 = local_f20._0_8_;
      uStack_1878 = local_f20._8_8_;
      uStack_1870 = local_f20._16_8_;
      uStack_1868 = local_f20._24_8_;
      local_840 = local_f20._0_8_;
      uVar25 = local_840;
      uStack_838 = local_f20._8_8_;
      uVar29 = uStack_838;
      uStack_830 = local_f20._16_8_;
      uVar10 = uStack_830;
      uStack_828 = local_f20._24_8_;
      uVar11 = uStack_828;
      local_860 = local_f20._0_8_;
      uStack_858 = local_f20._8_8_;
      uStack_850 = local_f20._16_8_;
      uStack_848 = local_f20._24_8_;
      local_840._0_4_ = local_f20._0_4_;
      local_840._4_4_ = local_f20._4_4_;
      uStack_838._0_4_ = local_f20._8_4_;
      uStack_838._4_4_ = local_f20._12_4_;
      uStack_830._0_4_ = local_f20._16_4_;
      uStack_830._4_4_ = local_f20._20_4_;
      uStack_828._0_4_ = local_f20._24_4_;
      uStack_828._4_4_ = local_f20._28_4_;
      local_11e0 = (float)local_840 * (float)local_840;
      fStack_11dc = local_840._4_4_ * local_840._4_4_;
      fStack_11d8 = (float)uStack_838 * (float)uStack_838;
      fStack_11d4 = uStack_838._4_4_ * uStack_838._4_4_;
      fStack_11d0 = (float)uStack_830 * (float)uStack_830;
      fStack_11cc = uStack_830._4_4_ * uStack_830._4_4_;
      fStack_11c8 = (float)uStack_828 * (float)uStack_828;
      local_11a8 = local_1840;
      fStack_11c4 = uStack_828._4_4_;
      local_18c0 = CONCAT44(fStack_11dc,local_11e0);
      uStack_18b8 = CONCAT44(fStack_11d4,fStack_11d8);
      uStack_18b0 = CONCAT44(fStack_11cc,fStack_11d0);
      uStack_18a8 = CONCAT44(uStack_828._4_4_,fStack_11c8);
      local_1f08 = (undefined8 *)(local_21b0 + 0x400 + (ulong)local_21e8 * 4);
      local_18e0 = *local_1f08;
      uStack_18d8 = local_1f08[1];
      uStack_18d0 = local_1f08[2];
      uStack_18c8 = local_1f08[3];
      local_ce8 = local_1f00;
      local_820._0_4_ = (float)local_18e0;
      local_820._4_4_ = (float)((ulong)local_18e0 >> 0x20);
      uStack_818._0_4_ = (float)uStack_18d8;
      uStack_818._4_4_ = (float)((ulong)uStack_18d8 >> 0x20);
      uStack_810._0_4_ = (float)uStack_18d0;
      uStack_810._4_4_ = (float)((ulong)uStack_18d0 >> 0x20);
      uStack_808._0_4_ = (float)uStack_18c8;
      local_11a0 = local_11e0 * (float)local_820;
      fStack_119c = fStack_11dc * local_820._4_4_;
      fStack_1198 = fStack_11d8 * (float)uStack_818;
      fStack_1194 = fStack_11d4 * uStack_818._4_4_;
      fStack_1190 = fStack_11d0 * (float)uStack_810;
      fStack_118c = fStack_11cc * uStack_810._4_4_;
      fStack_1188 = fStack_11c8 * (float)uStack_808;
      local_1168 = local_18a0;
      fStack_1184 = uStack_828._4_4_;
      local_1500 = CONCAT44(fStack_119c,local_11a0);
      uStack_14f8 = CONCAT44(fStack_1194,fStack_1198);
      uStack_14f0 = CONCAT44(fStack_118c,fStack_1190);
      uStack_14e8 = CONCAT44(uStack_828._4_4_,fStack_1188);
      local_1320 = fVar16 + local_11a0;
      fStack_131c = fVar19 + fStack_119c;
      fStack_1318 = fVar20 + fStack_1198;
      fStack_1314 = fVar23 + fStack_1194;
      fStack_1310 = fVar24 + fStack_1190;
      fStack_130c = fVar27 + fStack_118c;
      fStack_1308 = fVar28 + fStack_1188;
      fStack_1304 = fVar14 + uStack_828._4_4_;
      local_12e8 = local_14c0;
      local_1630 = CONCAT44(fStack_131c,local_1320);
      uStack_1628 = CONCAT44(fStack_1314,fStack_1318);
      local_1650 = CONCAT44(fStack_130c,fStack_1310);
      uStack_1648 = CONCAT44(fStack_1304,fStack_1308);
      local_1608 = &local_21e0;
      local_1458 = local_1620;
      local_530 = local_21e0;
      uStack_528 = uStack_21d8;
      local_190._0_4_ = (float)local_21e0;
      local_190._4_4_ = (float)((ulong)local_21e0 >> 0x20);
      uStack_188._0_4_ = (float)uStack_21d8;
      uStack_188._4_4_ = (float)((ulong)uStack_21d8 >> 0x20);
      local_4c0 = (float)local_190 + local_1320;
      fStack_4bc = local_190._4_4_ + fStack_131c;
      fStack_4b8 = (float)uStack_188 + fStack_1318;
      fStack_4b4 = uStack_188._4_4_ + fStack_1314;
      local_4a8 = local_4d0;
      local_5d0 = CONCAT44(fStack_4bc,local_4c0);
      uStack_5c8 = CONCAT44(fStack_4b4,fStack_4b8);
      local_1478 = local_1640;
      local_560 = local_4c0 + fStack_1310;
      fStack_55c = fStack_4bc + fStack_130c;
      fStack_558 = fStack_4b8 + fStack_1308;
      fStack_554 = fStack_4b4 + fStack_1304;
      local_548 = local_570;
      local_21e0 = CONCAT44(fStack_55c,local_560);
      uStack_21d8 = CONCAT44(fStack_554,fStack_558);
      local_21e8 = local_21e8 + 8;
      local_1600 = local_1630;
      uStack_15f8 = uStack_1628;
      uStack_15f0 = local_1650;
      uStack_15e8 = uStack_1648;
      local_14e0 = uVar17;
      uStack_14d8 = uVar21;
      uStack_14d0 = uVar4;
      uStack_14c8 = uVar5;
      local_1490 = local_1650;
      uStack_1488 = uStack_1648;
      local_1470 = local_1630;
      uStack_1468 = uStack_1628;
      local_1380 = local_1ec8;
      local_1378 = local_1f08;
      local_d60 = local_1ca0;
      uStack_d58 = uStack_1c98;
      uStack_d50 = uStack_1c90;
      uStack_d48 = uStack_1c88;
      local_d20 = local_18e0;
      uStack_d18 = uStack_18d8;
      uStack_d10 = uStack_18d0;
      uStack_d08 = uStack_18c8;
      local_a20 = local_1ca0;
      uStack_a18 = uStack_1c98;
      uStack_a10 = uStack_1c90;
      uStack_a08 = uStack_1c88;
      local_840 = uVar25;
      uStack_838 = uVar29;
      uStack_830 = uVar10;
      uStack_828 = uVar11;
      local_820 = local_18e0;
      uStack_818 = uStack_18d8;
      uStack_810 = uStack_18d0;
      uStack_808 = uStack_18c8;
      local_800 = local_18c0;
      uStack_7f8 = uStack_18b8;
      uStack_7f0 = uStack_18b0;
      uStack_7e8 = uStack_18a8;
      local_5e0 = local_1650;
      uStack_5d8 = uStack_1648;
      local_5c0 = local_21e0;
      uStack_5b8 = uStack_21d8;
      local_5a8 = local_1608;
      local_5a0 = local_1650;
      uStack_598 = uStack_1648;
      local_590 = local_1650;
      uStack_588 = uStack_1648;
      local_580 = local_5d0;
      uStack_578 = uStack_5c8;
      local_540 = local_1630;
      uStack_538 = uStack_1628;
      local_520 = local_5d0;
      uStack_518 = uStack_5c8;
      local_508 = local_1608;
      local_500 = local_1630;
      uStack_4f8 = uStack_1628;
      local_4f0 = local_1630;
      uStack_4e8 = uStack_1628;
      local_4e0 = local_530;
      uStack_4d8 = uStack_528;
      local_1a0 = local_1630;
      uStack_198 = uStack_1628;
      local_190 = local_530;
      uStack_188 = uStack_528;
      local_180 = local_1650;
      uStack_178 = uStack_1648;
      local_170 = local_5d0;
      uStack_168 = uStack_5c8;
      local_100 = local_1500;
      uStack_f8 = uStack_14f8;
      uStack_f0 = uStack_14f0;
      uStack_e8 = uStack_14e8;
      local_e0 = uVar17;
      uStack_d8 = uVar21;
      uStack_d0 = uVar4;
      uStack_c8 = uVar5;
    }
  }
  auVar9._8_8_ = uStack_21d8;
  auVar9._0_8_ = local_21e0;
  auVar3._8_8_ = uStack_21d8;
  auVar3._0_8_ = local_21e0;
  auVar3 = vunpckhpd_avx(auVar3,auVar9);
  local_150 = (float)local_21e0;
  fStack_14c = (float)((ulong)local_21e0 >> 0x20);
  local_160 = auVar3._0_4_;
  fStack_15c = auVar3._4_4_;
  return local_150 + local_160 + fStack_14c + fStack_15c;
}

Assistant:

float compute_error_of_weight_set_2planes(
	const endpoints_and_weights& eai1,
	const endpoints_and_weights& eai2,
	const decimation_info& di,
	const float* dec_weight_quant_uvalue_plane1,
	const float* dec_weight_quant_uvalue_plane2
) {
	vfloatacc error_summav = vfloatacc::zero();
	unsigned int texel_count = di.texel_count;
	promise(texel_count > 0);

	// Process SIMD-width chunks, safe to over-fetch - the extra space is zero initialized
	if (di.max_texel_weight_count > 2)
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Plane 1
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values1 = bilinear_infill_vla(di, dec_weight_quant_uvalue_plane1, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values1 = loada(eai1.weights + i);
			vfloat diff = current_values1 - actual_values1;
			vfloat error1 = diff * diff * loada(eai1.weight_error_scale + i);

			// Plane 2
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values2 = bilinear_infill_vla(di, dec_weight_quant_uvalue_plane2, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values2 = loada(eai2.weights + i);
			diff = current_values2 - actual_values2;
			vfloat error2 = diff * diff * loada(eai2.weight_error_scale + i);

			haccumulate(error_summav, error1 + error2);
		}
	}
	else if (di.max_texel_weight_count > 1)
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Plane 1
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values1 = bilinear_infill_vla_2(di, dec_weight_quant_uvalue_plane1, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values1 = loada(eai1.weights + i);
			vfloat diff = current_values1 - actual_values1;
			vfloat error1 = diff * diff * loada(eai1.weight_error_scale + i);

			// Plane 2
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values2 = bilinear_infill_vla_2(di, dec_weight_quant_uvalue_plane2, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values2 = loada(eai2.weights + i);
			diff = current_values2 - actual_values2;
			vfloat error2 = diff * diff * loada(eai2.weight_error_scale + i);

			haccumulate(error_summav, error1 + error2);
		}
	}
	else
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Plane 1
			// Load the weight set directly, without interpolation
			vfloat current_values1 = loada(dec_weight_quant_uvalue_plane1 + i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values1 = loada(eai1.weights + i);
			vfloat diff = current_values1 - actual_values1;
			vfloat error1 = diff * diff * loada(eai1.weight_error_scale + i);

			// Plane 2
			// Load the weight set directly, without interpolation
			vfloat current_values2 = loada(dec_weight_quant_uvalue_plane2 + i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values2 = loada(eai2.weights + i);
			diff = current_values2 - actual_values2;
			vfloat error2 = diff * diff * loada(eai2.weight_error_scale + i);

			haccumulate(error_summav, error1 + error2);
		}
	}

	// Resolve the final scalar accumulator sum
	return hadd_s(error_summav);
}